

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_clause_compute_lbd(sat_solver3 *s,clause *c)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar3 = 0;
  iVar1 = 0;
  for (uVar2 = 0; (uint)*c >> 0xb != uVar2; uVar2 = uVar2 + 1) {
    uVar4 = 1 << ((byte)s->levels[(int)c[uVar2 + 1] >> 1] & 0x1f);
    bVar5 = (uVar3 >> (s->levels[(int)c[uVar2 + 1] >> 1] & 0x1fU) & 1) != 0;
    if (bVar5) {
      uVar4 = 0;
    }
    iVar1 = (iVar1 + 1) - (uint)bVar5;
    uVar3 = uVar3 | uVar4;
  }
  return iVar1;
}

Assistant:

static inline int sat_clause_compute_lbd( sat_solver* s, clause* c )
{
    int i, lev, minl = 0, lbd = 0;
    for (i = 0; i < (int)c->size; i++)
    {
        lev = var_level(s, lit_var(c->lits[i]));
        if ( !(minl & (1 << (lev & 31))) )
        {
            minl |= 1 << (lev & 31);
            lbd++;
//            printf( "%d ", lev );
        }
    }
//    printf( " -> %d\n", lbd );
    return lbd;
}